

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O3

char * __thiscall cmTarget::GetProperty(cmTarget *this,string *prop)

{
  char cVar1;
  size_t __n;
  cmTargetInternals *pcVar2;
  __type _Var3;
  bool bVar4;
  int iVar5;
  const_iterator cVar6;
  string *psVar7;
  char *pcVar8;
  cmState *this_00;
  __hashtable *__h;
  __node_gen_type __node_gen;
  undefined1 local_60 [40];
  cmStateSnapshot local_38;
  
  if (GetProperty(std::__cxx11::string_const&)::specialProps_abi_cxx11_ == '\0') {
    GetProperty();
  }
  if ((GetProperty(std::__cxx11::string_const&)::propLINK_LIBRARIES_abi_cxx11_ == '\0') &&
     (iVar5 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&)::
                                   propLINK_LIBRARIES_abi_cxx11_), iVar5 != 0)) {
    GetProperty(std::__cxx11::string_const&)::propLINK_LIBRARIES_abi_cxx11_._M_dataplus._M_p =
         (pointer)&GetProperty(std::__cxx11::string_const&)::propLINK_LIBRARIES_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&GetProperty(std::__cxx11::string_const&)::propLINK_LIBRARIES_abi_cxx11_,
               "LINK_LIBRARIES","");
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetProperty(std::__cxx11::string_const&)::propLINK_LIBRARIES_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::propLINK_LIBRARIES_abi_cxx11_);
  }
  if ((GetProperty(std::__cxx11::string_const&)::propTYPE_abi_cxx11_ == '\0') &&
     (iVar5 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&)::propTYPE_abi_cxx11_),
     iVar5 != 0)) {
    GetProperty(std::__cxx11::string_const&)::propTYPE_abi_cxx11_._M_dataplus._M_p =
         (pointer)&GetProperty(std::__cxx11::string_const&)::propTYPE_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&GetProperty(std::__cxx11::string_const&)::propTYPE_abi_cxx11_,"TYPE","");
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetProperty(std::__cxx11::string_const&)::propTYPE_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::propTYPE_abi_cxx11_);
  }
  if ((GetProperty(std::__cxx11::string_const&)::propINCLUDE_DIRECTORIES_abi_cxx11_ == '\0') &&
     (iVar5 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&)::
                                   propINCLUDE_DIRECTORIES_abi_cxx11_), iVar5 != 0)) {
    GetProperty(std::__cxx11::string_const&)::propINCLUDE_DIRECTORIES_abi_cxx11_._M_dataplus._M_p =
         (pointer)&GetProperty(std::__cxx11::string_const&)::propINCLUDE_DIRECTORIES_abi_cxx11_.
                   field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)
               &GetProperty(std::__cxx11::string_const&)::propINCLUDE_DIRECTORIES_abi_cxx11_,
               "INCLUDE_DIRECTORIES","");
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetProperty(std::__cxx11::string_const&)::propINCLUDE_DIRECTORIES_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::
                         propINCLUDE_DIRECTORIES_abi_cxx11_);
  }
  if ((GetProperty(std::__cxx11::string_const&)::propCOMPILE_FEATURES_abi_cxx11_ == '\0') &&
     (iVar5 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&)::
                                   propCOMPILE_FEATURES_abi_cxx11_), iVar5 != 0)) {
    GetProperty(std::__cxx11::string_const&)::propCOMPILE_FEATURES_abi_cxx11_._M_dataplus._M_p =
         (pointer)&GetProperty(std::__cxx11::string_const&)::propCOMPILE_FEATURES_abi_cxx11_.field_2
    ;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&GetProperty(std::__cxx11::string_const&)::propCOMPILE_FEATURES_abi_cxx11_,
               "COMPILE_FEATURES","");
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetProperty(std::__cxx11::string_const&)::propCOMPILE_FEATURES_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::propCOMPILE_FEATURES_abi_cxx11_);
  }
  if ((GetProperty(std::__cxx11::string_const&)::propCOMPILE_OPTIONS_abi_cxx11_ == '\0') &&
     (iVar5 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&)::
                                   propCOMPILE_OPTIONS_abi_cxx11_), iVar5 != 0)) {
    GetProperty(std::__cxx11::string_const&)::propCOMPILE_OPTIONS_abi_cxx11_._M_dataplus._M_p =
         (pointer)&GetProperty(std::__cxx11::string_const&)::propCOMPILE_OPTIONS_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&GetProperty(std::__cxx11::string_const&)::propCOMPILE_OPTIONS_abi_cxx11_,
               "COMPILE_OPTIONS","");
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetProperty(std::__cxx11::string_const&)::propCOMPILE_OPTIONS_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::propCOMPILE_OPTIONS_abi_cxx11_);
  }
  if ((GetProperty(std::__cxx11::string_const&)::propCOMPILE_DEFINITIONS_abi_cxx11_ == '\0') &&
     (iVar5 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&)::
                                   propCOMPILE_DEFINITIONS_abi_cxx11_), iVar5 != 0)) {
    GetProperty(std::__cxx11::string_const&)::propCOMPILE_DEFINITIONS_abi_cxx11_._M_dataplus._M_p =
         (pointer)&GetProperty(std::__cxx11::string_const&)::propCOMPILE_DEFINITIONS_abi_cxx11_.
                   field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)
               &GetProperty(std::__cxx11::string_const&)::propCOMPILE_DEFINITIONS_abi_cxx11_,
               "COMPILE_DEFINITIONS","");
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetProperty(std::__cxx11::string_const&)::propCOMPILE_DEFINITIONS_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::
                         propCOMPILE_DEFINITIONS_abi_cxx11_);
  }
  if ((GetProperty(std::__cxx11::string_const&)::propLINK_OPTIONS_abi_cxx11_ == '\0') &&
     (iVar5 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&)::
                                   propLINK_OPTIONS_abi_cxx11_), iVar5 != 0)) {
    GetProperty(std::__cxx11::string_const&)::propLINK_OPTIONS_abi_cxx11_._M_dataplus._M_p =
         (pointer)&GetProperty(std::__cxx11::string_const&)::propLINK_OPTIONS_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&GetProperty(std::__cxx11::string_const&)::propLINK_OPTIONS_abi_cxx11_,
               "LINK_OPTIONS","");
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetProperty(std::__cxx11::string_const&)::propLINK_OPTIONS_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::propLINK_OPTIONS_abi_cxx11_);
  }
  if ((GetProperty(std::__cxx11::string_const&)::propLINK_DIRECTORIES_abi_cxx11_ == '\0') &&
     (iVar5 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&)::
                                   propLINK_DIRECTORIES_abi_cxx11_), iVar5 != 0)) {
    GetProperty(std::__cxx11::string_const&)::propLINK_DIRECTORIES_abi_cxx11_._M_dataplus._M_p =
         (pointer)&GetProperty(std::__cxx11::string_const&)::propLINK_DIRECTORIES_abi_cxx11_.field_2
    ;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&GetProperty(std::__cxx11::string_const&)::propLINK_DIRECTORIES_abi_cxx11_,
               "LINK_DIRECTORIES","");
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetProperty(std::__cxx11::string_const&)::propLINK_DIRECTORIES_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::propLINK_DIRECTORIES_abi_cxx11_);
  }
  if ((GetProperty(std::__cxx11::string_const&)::propIMPORTED_abi_cxx11_ == '\0') &&
     (iVar5 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&)::propIMPORTED_abi_cxx11_
                                 ), iVar5 != 0)) {
    GetProperty(std::__cxx11::string_const&)::propIMPORTED_abi_cxx11_._M_dataplus._M_p =
         (pointer)&GetProperty(std::__cxx11::string_const&)::propIMPORTED_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&GetProperty(std::__cxx11::string_const&)::propIMPORTED_abi_cxx11_,
               "IMPORTED","");
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetProperty(std::__cxx11::string_const&)::propIMPORTED_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::propIMPORTED_abi_cxx11_);
  }
  if ((GetProperty(std::__cxx11::string_const&)::propIMPORTED_GLOBAL_abi_cxx11_ == '\0') &&
     (iVar5 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&)::
                                   propIMPORTED_GLOBAL_abi_cxx11_), iVar5 != 0)) {
    GetProperty(std::__cxx11::string_const&)::propIMPORTED_GLOBAL_abi_cxx11_._M_dataplus._M_p =
         (pointer)&GetProperty(std::__cxx11::string_const&)::propIMPORTED_GLOBAL_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&GetProperty(std::__cxx11::string_const&)::propIMPORTED_GLOBAL_abi_cxx11_,
               "IMPORTED_GLOBAL","");
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetProperty(std::__cxx11::string_const&)::propIMPORTED_GLOBAL_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::propIMPORTED_GLOBAL_abi_cxx11_);
  }
  if ((GetProperty(std::__cxx11::string_const&)::propMANUALLY_ADDED_DEPENDENCIES_abi_cxx11_ == '\0')
     && (iVar5 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&)::
                                      propMANUALLY_ADDED_DEPENDENCIES_abi_cxx11_), iVar5 != 0)) {
    GetProperty(std::__cxx11::string_const&)::propMANUALLY_ADDED_DEPENDENCIES_abi_cxx11_._M_dataplus
    ._M_p = (pointer)&GetProperty(std::__cxx11::string_const&)::
                      propMANUALLY_ADDED_DEPENDENCIES_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)
               &GetProperty(std::__cxx11::string_const&)::propMANUALLY_ADDED_DEPENDENCIES_abi_cxx11_
               ,"MANUALLY_ADDED_DEPENDENCIES","");
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetProperty(std::__cxx11::string_const&)::
                  propMANUALLY_ADDED_DEPENDENCIES_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::
                         propMANUALLY_ADDED_DEPENDENCIES_abi_cxx11_);
  }
  if ((GetProperty(std::__cxx11::string_const&)::propNAME_abi_cxx11_ == '\0') &&
     (iVar5 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&)::propNAME_abi_cxx11_),
     iVar5 != 0)) {
    GetProperty(std::__cxx11::string_const&)::propNAME_abi_cxx11_._M_dataplus._M_p =
         (pointer)&GetProperty(std::__cxx11::string_const&)::propNAME_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&GetProperty(std::__cxx11::string_const&)::propNAME_abi_cxx11_,"NAME","");
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetProperty(std::__cxx11::string_const&)::propNAME_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::propNAME_abi_cxx11_);
  }
  if ((GetProperty(std::__cxx11::string_const&)::propBINARY_DIR_abi_cxx11_ == '\0') &&
     (iVar5 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&)::
                                   propBINARY_DIR_abi_cxx11_), iVar5 != 0)) {
    GetProperty(std::__cxx11::string_const&)::propBINARY_DIR_abi_cxx11_._M_dataplus._M_p =
         (pointer)&GetProperty(std::__cxx11::string_const&)::propBINARY_DIR_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&GetProperty(std::__cxx11::string_const&)::propBINARY_DIR_abi_cxx11_,
               "BINARY_DIR","");
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetProperty(std::__cxx11::string_const&)::propBINARY_DIR_abi_cxx11_,&__dso_handle)
    ;
    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::propBINARY_DIR_abi_cxx11_);
  }
  if ((GetProperty(std::__cxx11::string_const&)::propSOURCE_DIR_abi_cxx11_ == '\0') &&
     (iVar5 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&)::
                                   propSOURCE_DIR_abi_cxx11_), iVar5 != 0)) {
    GetProperty(std::__cxx11::string_const&)::propSOURCE_DIR_abi_cxx11_._M_dataplus._M_p =
         (pointer)&GetProperty(std::__cxx11::string_const&)::propSOURCE_DIR_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&GetProperty(std::__cxx11::string_const&)::propSOURCE_DIR_abi_cxx11_,
               "SOURCE_DIR","");
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetProperty(std::__cxx11::string_const&)::propSOURCE_DIR_abi_cxx11_,&__dso_handle)
    ;
    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::propSOURCE_DIR_abi_cxx11_);
  }
  if ((GetProperty(std::__cxx11::string_const&)::propSOURCES_abi_cxx11_ == '\0') &&
     (iVar5 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&)::propSOURCES_abi_cxx11_)
     , iVar5 != 0)) {
    GetProperty(std::__cxx11::string_const&)::propSOURCES_abi_cxx11_._M_dataplus._M_p =
         (pointer)&GetProperty(std::__cxx11::string_const&)::propSOURCES_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&GetProperty(std::__cxx11::string_const&)::propSOURCES_abi_cxx11_,"SOURCES"
               ,"");
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetProperty(std::__cxx11::string_const&)::propSOURCES_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&)::propSOURCES_abi_cxx11_);
  }
  if (GetProperty(std::__cxx11::string_const&)::specialProps_abi_cxx11_._M_h._M_element_count == 0)
  {
    local_60._0_8_ = &GetProperty(std::__cxx11::string_const&)::specialProps_abi_cxx11_;
    std::
    _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
              ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)&GetProperty(std::__cxx11::string_const&)::specialProps_abi_cxx11_,
               &GetProperty(std::__cxx11::string_const&)::propLINK_LIBRARIES_abi_cxx11_,local_60);
    local_60._0_8_ = &GetProperty(std::__cxx11::string_const&)::specialProps_abi_cxx11_;
    std::
    _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
              ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)&GetProperty(std::__cxx11::string_const&)::specialProps_abi_cxx11_,
               &GetProperty(std::__cxx11::string_const&)::propTYPE_abi_cxx11_,local_60);
    local_60._0_8_ = &GetProperty(std::__cxx11::string_const&)::specialProps_abi_cxx11_;
    std::
    _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
              ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)&GetProperty(std::__cxx11::string_const&)::specialProps_abi_cxx11_,
               &GetProperty(std::__cxx11::string_const&)::propINCLUDE_DIRECTORIES_abi_cxx11_,
               local_60);
    local_60._0_8_ = &GetProperty(std::__cxx11::string_const&)::specialProps_abi_cxx11_;
    std::
    _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
              ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)&GetProperty(std::__cxx11::string_const&)::specialProps_abi_cxx11_,
               &GetProperty(std::__cxx11::string_const&)::propCOMPILE_FEATURES_abi_cxx11_,local_60);
    local_60._0_8_ = &GetProperty(std::__cxx11::string_const&)::specialProps_abi_cxx11_;
    std::
    _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
              ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)&GetProperty(std::__cxx11::string_const&)::specialProps_abi_cxx11_,
               &GetProperty(std::__cxx11::string_const&)::propCOMPILE_OPTIONS_abi_cxx11_,local_60);
    local_60._0_8_ = &GetProperty(std::__cxx11::string_const&)::specialProps_abi_cxx11_;
    std::
    _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
              ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)&GetProperty(std::__cxx11::string_const&)::specialProps_abi_cxx11_,
               &GetProperty(std::__cxx11::string_const&)::propCOMPILE_DEFINITIONS_abi_cxx11_,
               local_60);
    local_60._0_8_ = &GetProperty(std::__cxx11::string_const&)::specialProps_abi_cxx11_;
    std::
    _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
              ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)&GetProperty(std::__cxx11::string_const&)::specialProps_abi_cxx11_,
               &GetProperty(std::__cxx11::string_const&)::propLINK_OPTIONS_abi_cxx11_,local_60);
    local_60._0_8_ = &GetProperty(std::__cxx11::string_const&)::specialProps_abi_cxx11_;
    std::
    _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
              ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)&GetProperty(std::__cxx11::string_const&)::specialProps_abi_cxx11_,
               &GetProperty(std::__cxx11::string_const&)::propLINK_DIRECTORIES_abi_cxx11_,local_60);
    local_60._0_8_ = &GetProperty(std::__cxx11::string_const&)::specialProps_abi_cxx11_;
    std::
    _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
              ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)&GetProperty(std::__cxx11::string_const&)::specialProps_abi_cxx11_,
               &GetProperty(std::__cxx11::string_const&)::propIMPORTED_abi_cxx11_,local_60);
    local_60._0_8_ = &GetProperty(std::__cxx11::string_const&)::specialProps_abi_cxx11_;
    std::
    _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
              ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)&GetProperty(std::__cxx11::string_const&)::specialProps_abi_cxx11_,
               &GetProperty(std::__cxx11::string_const&)::propIMPORTED_GLOBAL_abi_cxx11_,local_60);
    local_60._0_8_ = &GetProperty(std::__cxx11::string_const&)::specialProps_abi_cxx11_;
    std::
    _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
              ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)&GetProperty(std::__cxx11::string_const&)::specialProps_abi_cxx11_,
               &GetProperty(std::__cxx11::string_const&)::propMANUALLY_ADDED_DEPENDENCIES_abi_cxx11_
               ,local_60);
    local_60._0_8_ = &GetProperty(std::__cxx11::string_const&)::specialProps_abi_cxx11_;
    std::
    _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
              ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)&GetProperty(std::__cxx11::string_const&)::specialProps_abi_cxx11_,
               &GetProperty(std::__cxx11::string_const&)::propNAME_abi_cxx11_,local_60);
    local_60._0_8_ = &GetProperty(std::__cxx11::string_const&)::specialProps_abi_cxx11_;
    std::
    _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
              ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)&GetProperty(std::__cxx11::string_const&)::specialProps_abi_cxx11_,
               &GetProperty(std::__cxx11::string_const&)::propBINARY_DIR_abi_cxx11_,local_60);
    local_60._0_8_ = &GetProperty(std::__cxx11::string_const&)::specialProps_abi_cxx11_;
    std::
    _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
              ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)&GetProperty(std::__cxx11::string_const&)::specialProps_abi_cxx11_,
               &GetProperty(std::__cxx11::string_const&)::propSOURCE_DIR_abi_cxx11_,local_60);
    local_60._0_8_ = &GetProperty(std::__cxx11::string_const&)::specialProps_abi_cxx11_;
    std::
    _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
              ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)&GetProperty(std::__cxx11::string_const&)::specialProps_abi_cxx11_,
               &GetProperty(std::__cxx11::string_const&)::propSOURCES_abi_cxx11_,local_60);
  }
  cVar6 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::find(&GetProperty(std::__cxx11::string_const&)::specialProps_abi_cxx11_._M_h,prop);
  if (cVar6.
      super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
      ._M_cur == (__node_type *)0x0) {
LAB_0020122b:
    pcVar8 = cmPropertyMap::GetPropertyValue(&this->Properties,prop);
    if (pcVar8 == (char *)0x0) {
      this_00 = cmMakefile::GetState(this->Makefile);
      pcVar8 = (char *)0x0;
      bVar4 = cmState::IsPropertyChained(this_00,prop,TARGET);
      if (bVar4) {
        cmMakefile::GetStateSnapshot(this->Makefile);
        cmStateSnapshot::GetDirectory((cmStateDirectory *)local_60,&local_38);
        pcVar8 = cmStateDirectory::GetProperty((cmStateDirectory *)local_60,prop,true);
      }
    }
  }
  else {
    __n = prop->_M_string_length;
    if ((__n == GetProperty(std::__cxx11::string_const&)::propLINK_LIBRARIES_abi_cxx11_.
                _M_string_length) &&
       ((__n == 0 ||
        (iVar5 = bcmp((prop->_M_dataplus)._M_p,
                      GetProperty(std::__cxx11::string_const&)::propLINK_LIBRARIES_abi_cxx11_.
                      _M_dataplus._M_p,__n), iVar5 == 0)))) {
      pcVar2 = (this->Internal).Pointer;
      if ((pcVar2->LinkImplementationPropertyEntries).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (pcVar2->LinkImplementationPropertyEntries).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        if (GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_ == '\0') {
          GetProperty();
        }
        cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  ((string *)local_60,&((this->Internal).Pointer)->LinkImplementationPropertyEntries
                   ,";");
        std::__cxx11::string::operator=
                  ((string *)&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_,
                   (string *)local_60);
        if ((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_60._0_8_ ==
            (unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_60 + 0x10)) {
          return GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_._M_dataplus._M_p;
        }
        operator_delete((void *)local_60._0_8_,local_60._16_8_ + 1);
        return GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_._M_dataplus._M_p;
      }
    }
    else {
      if ((__n == GetProperty(std::__cxx11::string_const&)::propTYPE_abi_cxx11_._M_string_length) &&
         ((__n == 0 ||
          (iVar5 = bcmp((prop->_M_dataplus)._M_p,
                        GetProperty(std::__cxx11::string_const&)::propTYPE_abi_cxx11_._M_dataplus.
                        _M_p,__n), iVar5 == 0)))) {
        pcVar8 = cmState::GetTargetTypeName(this->TargetTypeValue);
        return pcVar8;
      }
      if ((__n == GetProperty(std::__cxx11::string_const&)::propINCLUDE_DIRECTORIES_abi_cxx11_.
                  _M_string_length) &&
         ((__n == 0 ||
          (iVar5 = bcmp((prop->_M_dataplus)._M_p,
                        GetProperty(std::__cxx11::string_const&)::propINCLUDE_DIRECTORIES_abi_cxx11_
                        ._M_dataplus._M_p,__n), iVar5 == 0)))) {
        pcVar2 = (this->Internal).Pointer;
        if ((pcVar2->IncludeDirectoriesEntries).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (pcVar2->IncludeDirectoriesEntries).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          if (GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_ == '\0') {
            GetProperty();
          }
          cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                    ((string *)local_60,&((this->Internal).Pointer)->IncludeDirectoriesEntries,";");
          std::__cxx11::string::operator=
                    ((string *)&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_,
                     (string *)local_60);
          if ((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_60._0_8_ ==
              (unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_60 + 0x10)) {
            return GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_._M_dataplus._M_p;
          }
          operator_delete((void *)local_60._0_8_,local_60._16_8_ + 1);
          return GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_._M_dataplus._M_p;
        }
      }
      else if ((__n == GetProperty(std::__cxx11::string_const&)::propCOMPILE_FEATURES_abi_cxx11_.
                       _M_string_length) &&
              ((__n == 0 ||
               (iVar5 = bcmp((prop->_M_dataplus)._M_p,
                             GetProperty(std::__cxx11::string_const&)::
                             propCOMPILE_FEATURES_abi_cxx11_._M_dataplus._M_p,__n), iVar5 == 0)))) {
        pcVar2 = (this->Internal).Pointer;
        if ((pcVar2->CompileFeaturesEntries).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (pcVar2->CompileFeaturesEntries).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          if (GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_ == '\0') {
            GetProperty();
          }
          cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                    ((string *)local_60,&((this->Internal).Pointer)->CompileFeaturesEntries,";");
          std::__cxx11::string::operator=
                    ((string *)&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_,
                     (string *)local_60);
          if ((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_60._0_8_ ==
              (unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_60 + 0x10)) {
            return GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_._M_dataplus._M_p;
          }
          operator_delete((void *)local_60._0_8_,local_60._16_8_ + 1);
          return GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_._M_dataplus._M_p;
        }
      }
      else if ((__n == GetProperty(std::__cxx11::string_const&)::propCOMPILE_OPTIONS_abi_cxx11_.
                       _M_string_length) &&
              ((__n == 0 ||
               (iVar5 = bcmp((prop->_M_dataplus)._M_p,
                             GetProperty(std::__cxx11::string_const&)::
                             propCOMPILE_OPTIONS_abi_cxx11_._M_dataplus._M_p,__n), iVar5 == 0)))) {
        pcVar2 = (this->Internal).Pointer;
        if ((pcVar2->CompileOptionsEntries).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (pcVar2->CompileOptionsEntries).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          if (GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_ == '\0') {
            GetProperty();
          }
          cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                    ((string *)local_60,&((this->Internal).Pointer)->CompileOptionsEntries,";");
          std::__cxx11::string::operator=
                    ((string *)&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_,
                     (string *)local_60);
          if ((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_60._0_8_ ==
              (unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_60 + 0x10)) {
            return GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_._M_dataplus._M_p;
          }
          operator_delete((void *)local_60._0_8_,local_60._16_8_ + 1);
          return GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_._M_dataplus._M_p;
        }
      }
      else {
        _Var3 = std::operator==(prop,&GetProperty(std::__cxx11::string_const&)::
                                      propCOMPILE_DEFINITIONS_abi_cxx11_);
        if (_Var3) {
          pcVar2 = (this->Internal).Pointer;
          if ((pcVar2->CompileDefinitionsEntries).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              (pcVar2->CompileDefinitionsEntries).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            if (GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_ == '\0') {
              GetProperty();
            }
            cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                      ((string *)local_60,&((this->Internal).Pointer)->CompileDefinitionsEntries,";"
                      );
            std::__cxx11::string::operator=
                      ((string *)&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_,
                       (string *)local_60);
            if ((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_60._0_8_ ==
                (unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_60 + 0x10)) {
              return GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_._M_dataplus._M_p;
            }
            operator_delete((void *)local_60._0_8_,local_60._16_8_ + 1);
            return GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_._M_dataplus._M_p;
          }
        }
        else {
          _Var3 = std::operator==(prop,&GetProperty(std::__cxx11::string_const&)::
                                        propLINK_OPTIONS_abi_cxx11_);
          if (_Var3) {
            pcVar2 = (this->Internal).Pointer;
            if ((pcVar2->LinkOptionsEntries).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start !=
                (pcVar2->LinkOptionsEntries).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              if (GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_ == '\0') {
                GetProperty();
              }
              cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                        ((string *)local_60,&((this->Internal).Pointer)->LinkOptionsEntries,";");
              std::__cxx11::string::operator=
                        ((string *)&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_,
                         (string *)local_60);
              if ((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_60._0_8_ ==
                  (unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_60 + 0x10)) {
                return GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_._M_dataplus._M_p;
              }
              operator_delete((void *)local_60._0_8_,local_60._16_8_ + 1);
              return GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_._M_dataplus._M_p;
            }
          }
          else {
            _Var3 = std::operator==(prop,&GetProperty(std::__cxx11::string_const&)::
                                          propLINK_DIRECTORIES_abi_cxx11_);
            if (_Var3) {
              pcVar2 = (this->Internal).Pointer;
              if ((pcVar2->LinkDirectoriesEntries).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start !=
                  (pcVar2->LinkDirectoriesEntries).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
                if (GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_ == '\0') {
                  GetProperty();
                }
                cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                          ((string *)local_60,&((this->Internal).Pointer)->LinkDirectoriesEntries,
                           ";");
                std::__cxx11::string::operator=
                          ((string *)&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_,
                           (string *)local_60);
                if ((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_60._0_8_ ==
                    (unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)(local_60 + 0x10)) {
                  return GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_._M_dataplus.
                         _M_p;
                }
                operator_delete((void *)local_60._0_8_,local_60._16_8_ + 1);
                return GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_._M_dataplus._M_p;
              }
            }
            else {
              _Var3 = std::operator==(prop,&GetProperty(std::__cxx11::string_const&)::
                                            propMANUALLY_ADDED_DEPENDENCIES_abi_cxx11_);
              if (!_Var3) {
                _Var3 = std::operator==(prop,&GetProperty(std::__cxx11::string_const&)::
                                              propIMPORTED_abi_cxx11_);
                if (_Var3) {
                  cVar1 = this->IsImportedTarget;
LAB_0020117e:
                  if (cVar1 == '\0') {
                    return "FALSE";
                  }
                  return "TRUE";
                }
                _Var3 = std::operator==(prop,&GetProperty(std::__cxx11::string_const&)::
                                              propIMPORTED_GLOBAL_abi_cxx11_);
                if (_Var3) {
                  cVar1 = this->ImportedGloballyVisible;
                  goto LAB_0020117e;
                }
                _Var3 = std::operator==(prop,&GetProperty(std::__cxx11::string_const&)::
                                              propNAME_abi_cxx11_);
                if (_Var3) {
                  return (this->Name)._M_dataplus._M_p;
                }
                _Var3 = std::operator==(prop,&GetProperty(std::__cxx11::string_const&)::
                                              propBINARY_DIR_abi_cxx11_);
                if (_Var3) {
                  cmMakefile::GetStateSnapshot(this->Makefile);
                  cmStateSnapshot::GetDirectory((cmStateDirectory *)local_60,&local_38);
                  psVar7 = cmStateDirectory::GetCurrentBinary_abi_cxx11_
                                     ((cmStateDirectory *)local_60);
LAB_00201226:
                  return (psVar7->_M_dataplus)._M_p;
                }
                _Var3 = std::operator==(prop,&GetProperty(std::__cxx11::string_const&)::
                                              propSOURCE_DIR_abi_cxx11_);
                if (_Var3) {
                  cmMakefile::GetStateSnapshot(this->Makefile);
                  cmStateSnapshot::GetDirectory((cmStateDirectory *)local_60,&local_38);
                  psVar7 = cmStateDirectory::GetCurrentSource_abi_cxx11_
                                     ((cmStateDirectory *)local_60);
                  goto LAB_00201226;
                }
                goto LAB_0020122b;
              }
              if ((this->Utilities)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
                if (GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_ == '\0') {
                  GetProperty();
                }
                cmJoin<std::set<BT<std::__cxx11::string>,std::less<BT<std::__cxx11::string>>,std::allocator<BT<std::__cxx11::string>>>>
                          ((string *)local_60,&this->Utilities,";");
                std::__cxx11::string::operator=
                          ((string *)&GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_,
                           (string *)local_60);
                if ((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_60._0_8_ ==
                    (unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)(local_60 + 0x10)) {
                  return GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_._M_dataplus.
                         _M_p;
                }
                operator_delete((void *)local_60._0_8_,local_60._16_8_ + 1);
                return GetProperty(std::__cxx11::string_const&)::output_abi_cxx11_._M_dataplus._M_p;
              }
            }
          }
        }
      }
    }
    pcVar8 = (char *)0x0;
  }
  return pcVar8;
}

Assistant:

const char* cmTarget::GetProperty(const std::string& prop) const
{
  static std::unordered_set<std::string> specialProps;
#define MAKE_STATIC_PROP(PROP) static const std::string prop##PROP = #PROP
  MAKE_STATIC_PROP(LINK_LIBRARIES);
  MAKE_STATIC_PROP(TYPE);
  MAKE_STATIC_PROP(INCLUDE_DIRECTORIES);
  MAKE_STATIC_PROP(COMPILE_FEATURES);
  MAKE_STATIC_PROP(COMPILE_OPTIONS);
  MAKE_STATIC_PROP(COMPILE_DEFINITIONS);
  MAKE_STATIC_PROP(LINK_OPTIONS);
  MAKE_STATIC_PROP(LINK_DIRECTORIES);
  MAKE_STATIC_PROP(IMPORTED);
  MAKE_STATIC_PROP(IMPORTED_GLOBAL);
  MAKE_STATIC_PROP(MANUALLY_ADDED_DEPENDENCIES);
  MAKE_STATIC_PROP(NAME);
  MAKE_STATIC_PROP(BINARY_DIR);
  MAKE_STATIC_PROP(SOURCE_DIR);
  MAKE_STATIC_PROP(SOURCES);
#undef MAKE_STATIC_PROP
  if (specialProps.empty()) {
    specialProps.insert(propLINK_LIBRARIES);
    specialProps.insert(propTYPE);
    specialProps.insert(propINCLUDE_DIRECTORIES);
    specialProps.insert(propCOMPILE_FEATURES);
    specialProps.insert(propCOMPILE_OPTIONS);
    specialProps.insert(propCOMPILE_DEFINITIONS);
    specialProps.insert(propLINK_OPTIONS);
    specialProps.insert(propLINK_DIRECTORIES);
    specialProps.insert(propIMPORTED);
    specialProps.insert(propIMPORTED_GLOBAL);
    specialProps.insert(propMANUALLY_ADDED_DEPENDENCIES);
    specialProps.insert(propNAME);
    specialProps.insert(propBINARY_DIR);
    specialProps.insert(propSOURCE_DIR);
    specialProps.insert(propSOURCES);
  }
  if (specialProps.count(prop)) {
    if (prop == propLINK_LIBRARIES) {
      if (this->Internal->LinkImplementationPropertyEntries.empty()) {
        return nullptr;
      }

      static std::string output;
      output = cmJoin(this->Internal->LinkImplementationPropertyEntries, ";");
      return output.c_str();
    }
    // the type property returns what type the target is
    if (prop == propTYPE) {
      return cmState::GetTargetTypeName(this->GetType());
    }
    if (prop == propINCLUDE_DIRECTORIES) {
      if (this->Internal->IncludeDirectoriesEntries.empty()) {
        return nullptr;
      }

      static std::string output;
      output = cmJoin(this->Internal->IncludeDirectoriesEntries, ";");
      return output.c_str();
    }
    if (prop == propCOMPILE_FEATURES) {
      if (this->Internal->CompileFeaturesEntries.empty()) {
        return nullptr;
      }

      static std::string output;
      output = cmJoin(this->Internal->CompileFeaturesEntries, ";");
      return output.c_str();
    }
    if (prop == propCOMPILE_OPTIONS) {
      if (this->Internal->CompileOptionsEntries.empty()) {
        return nullptr;
      }

      static std::string output;
      output = cmJoin(this->Internal->CompileOptionsEntries, ";");
      return output.c_str();
    }
    if (prop == propCOMPILE_DEFINITIONS) {
      if (this->Internal->CompileDefinitionsEntries.empty()) {
        return nullptr;
      }

      static std::string output;
      output = cmJoin(this->Internal->CompileDefinitionsEntries, ";");
      return output.c_str();
    }
    if (prop == propLINK_OPTIONS) {
      if (this->Internal->LinkOptionsEntries.empty()) {
        return nullptr;
      }

      static std::string output;
      output = cmJoin(this->Internal->LinkOptionsEntries, ";");
      return output.c_str();
    }
    if (prop == propLINK_DIRECTORIES) {
      if (this->Internal->LinkDirectoriesEntries.empty()) {
        return nullptr;
      }

      static std::string output;
      output = cmJoin(this->Internal->LinkDirectoriesEntries, ";");

      return output.c_str();
    }
    if (prop == propMANUALLY_ADDED_DEPENDENCIES) {
      if (this->Utilities.empty()) {
        return nullptr;
      }

      static std::string output;
      output = cmJoin(this->Utilities, ";");
      return output.c_str();
    }
    if (prop == propIMPORTED) {
      return this->IsImported() ? "TRUE" : "FALSE";
    }
    if (prop == propIMPORTED_GLOBAL) {
      return this->IsImportedGloballyVisible() ? "TRUE" : "FALSE";
    }
    if (prop == propNAME) {
      return this->GetName().c_str();
    }
    if (prop == propBINARY_DIR) {
      return this->GetMakefile()
        ->GetStateSnapshot()
        .GetDirectory()
        .GetCurrentBinary()
        .c_str();
    }
    if (prop == propSOURCE_DIR) {
      return this->GetMakefile()
        ->GetStateSnapshot()
        .GetDirectory()
        .GetCurrentSource()
        .c_str();
    }
  }

  const char* retVal = this->Properties.GetPropertyValue(prop);
  if (!retVal) {
    const bool chain = this->GetMakefile()->GetState()->IsPropertyChained(
      prop, cmProperty::TARGET);
    if (chain) {
      return this->Makefile->GetStateSnapshot().GetDirectory().GetProperty(
        prop, chain);
    }
  }
  return retVal;
}